

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

PolarSpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (PolarSpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          PolarSpeakerPosition *pos)

{
  double azimuth;
  double elevation;
  tuple<double&,double&> local_a0 [32];
  ScreenEdgeLock local_80;
  pair<double,_double> local_30;
  PolarSpeakerPosition *local_20;
  PolarSpeakerPosition *pos_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  
  azimuth = pos->azimuth;
  elevation = pos->elevation;
  local_20 = pos;
  pos_local = (PolarSpeakerPosition *)this;
  this_local = (GainCalculatorDirectSpeakersImpl *)__return_storage_ptr__;
  ScreenEdgeLock::ScreenEdgeLock(&local_80,&pos->screenEdgeLock);
  local_30 = ScreenEdgeLockHandler::handleAzimuthElevation
                       (&this->_screenEdgeLockHandler,azimuth,elevation,&local_80);
  std::tie<double,double>((double *)local_a0,&pos->azimuth);
  std::tuple<double&,double&>::operator=(local_a0,&local_30);
  ScreenEdgeLock::~ScreenEdgeLock(&local_80);
  PolarSpeakerPosition::PolarSpeakerPosition(__return_storage_ptr__,pos);
  return __return_storage_ptr__;
}

Assistant:

PolarSpeakerPosition GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      PolarSpeakerPosition pos) {
    std::tie(pos.azimuth, pos.elevation) =
        _screenEdgeLockHandler.handleAzimuthElevation(
            pos.azimuth, pos.elevation, pos.screenEdgeLock);
    return pos;
  }